

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O0

char * soundfile_strerror(int errnum)

{
  char *pcStack_10;
  int errnum_local;
  
  switch(errnum) {
  case -0x3eb:
    pcStack_10 = "unsupported sample format";
    break;
  case -0x3ea:
    pcStack_10 = "unsupported header format version";
    break;
  case -0x3e9:
    pcStack_10 = "bad header format";
    break;
  case -1000:
    pcStack_10 = "unknown header format";
    break;
  default:
    pcStack_10 = strerror(errnum);
  }
  return pcStack_10;
}

Assistant:

const char* soundfile_strerror(int errnum)
{
    switch (errnum)
    {
        case SOUNDFILE_ERRUNKNOWN:
            return "unknown header format";
        case SOUNDFILE_ERRMALFORMED:
            return "bad header format";
        case SOUNDFILE_ERRVERSION:
            return "unsupported header format version";
        case SOUNDFILE_ERRSAMPLEFMT:
            return "unsupported sample format";
        default: /* C/POSIX error */
            return strerror(errnum);
    }
}